

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  CPState *cp;
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
  *(undefined4 *)((long)L->cframe + 0xc) = 0xffffffff;
  cp_init((CPState *)ud);
  if ((*(uint *)((long)ud + 0x74) & 1) == 0) {
    cp_decl_single((CPState *)ud);
  }
  else {
    cp_decl_multi((CPState *)ud);
  }
  if ((*(long *)((long)ud + 0x58) != 0) &&
     (*(long *)((long)ud + 0x58) != *(long *)(*(long *)((long)ud + 0x48) + 0x28))) {
    cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}